

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::StringBracketHelper
              (Arguments *args,ScriptContext *scriptContext,char16 *pszTag,charcount_t cchTag,
              char16 *pszProp,charcount_t cchProp)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  char16_t cVar4;
  BOOL BVar5;
  uint uVar6;
  uint uVar7;
  Var pvVar8;
  JavascriptString *pJVar9;
  ulong uVar10;
  undefined4 *puVar11;
  char16 *pcVar12;
  long lVar13;
  size_t count;
  ulong count_00;
  uint uVar14;
  char16_t *pcVar15;
  uint uVar16;
  uint uVar17;
  char16_t *pcVar18;
  uint length;
  ulong uVar19;
  char16 local_a0 [4];
  char16 quotStr [7];
  char16 *local_60;
  BufferStringBuilder local_50;
  BufferStringBuilder builder;
  
  quotStr[0] = L't';
  quotStr[1] = L';';
  quotStr[2] = L'\0';
  builtin_memcpy(local_a0,L"&quo",8);
  builder.m_string._4_4_ = cchProp;
  if (((ulong)args->Info & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec73,(PCWSTR)0x0);
  }
  bVar3 = ((scriptContext->config).threadConfig)->m_ES6StringPrototypeFixes;
  if (bVar3 != false) {
    pvVar8 = Arguments::operator[](args,0);
    BVar5 = JavascriptConversion::CheckObjectCoercible(pvVar8,scriptContext);
    if (BVar5 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,pszTag);
    }
  }
  pJVar9 = (JavascriptString *)0x0;
  pvVar8 = Arguments::operator[](args,0);
  bVar2 = VarIs<Js::JavascriptString>(pvVar8);
  if (bVar2) {
    pJVar9 = UnsafeVarTo<Js::JavascriptString>(pvVar8);
  }
  if (pJVar9 == (JavascriptString *)0x0) {
    pvVar8 = Arguments::operator[](args,0);
    pJVar9 = JavascriptConversion::ToString(pvVar8,scriptContext);
  }
  if (((int)cchTag < 0) || (0x7ffffffd < cchTag)) {
LAB_00d2bc70:
    ::Math::DefaultOverflowPolicy();
  }
  uVar16 = pJVar9->m_charLength;
  count_00 = (ulong)uVar16;
  uVar14 = cchTag * 2 + 5;
  unique0x100006c9 = pJVar9;
  if (pszProp == (char16 *)0x0) {
    local_60 = (char16 *)0x0;
    uVar17 = 0;
    count = 0;
    uVar7 = 0;
  }
  else {
    if (((ulong)args->Info & 0xfffffe) == 0) {
      pJVar9 = StringCache::GetUndefinedDisplay
                         (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache
                         );
    }
    else {
      pvVar8 = Arguments::operator[](args,1);
      bVar2 = VarIs<Js::JavascriptString>(pvVar8);
      if (bVar2) {
        pJVar9 = UnsafeVarTo<Js::JavascriptString>(pvVar8);
      }
      else {
        pJVar9 = (JavascriptString *)0x0;
      }
      if (pJVar9 == (JavascriptString *)0x0) {
        pvVar8 = Arguments::operator[](args,1);
        pJVar9 = JavascriptConversion::ToString(pvVar8,scriptContext);
      }
    }
    uVar7 = pJVar9->m_charLength;
    count = (size_t)uVar7;
    local_60 = GetString(pJVar9);
    uVar17 = 0;
    if ((bVar3 != false) && (uVar17 = 0, uVar7 != 0)) {
      uVar10 = 0;
      uVar17 = 0;
      do {
        uVar17 = uVar17 + (local_60[uVar10] == L'\"');
        uVar10 = uVar10 + 1;
      } while (count != uVar10);
    }
    if ((CARRY4(uVar14,builder.m_string._4_4_)) || (0xfffffffb < uVar14 + builder.m_string._4_4_))
    goto LAB_00d2bc70;
    uVar14 = uVar14 + builder.m_string._4_4_ + 4;
    uVar7 = builder.m_string._4_4_;
    if (bVar3 != false) {
      uVar6 = (uint)((ulong)uVar17 * 6);
      if (((int)((ulong)uVar17 * 6 >> 0x20) != 0) || (CARRY4(uVar6,uVar14))) goto LAB_00d2bc70;
      uVar14 = (uVar6 + uVar14) - uVar17;
    }
  }
  if (CARRY4(uVar16,uVar14)) goto LAB_00d2bc70;
  uVar6 = (uint)count;
  length = uVar16 + uVar14 + uVar6;
  if (CARRY4(uVar16 + uVar14,uVar6)) goto LAB_00d2bc70;
  builder.m_string._4_4_ = uVar7;
  if ((0x7ffffffe < length) || (length < uVar16)) {
    JavascriptError::ThrowOutOfMemoryError(scriptContext);
  }
  local_50.m_string = BufferStringBuilder::WritableString::New(length,scriptContext);
  BufferStringBuilder::DbgAssertNotFrozen(&local_50);
  pcVar15 = ((local_50.m_string)->super_JavascriptString).m_pszValue.ptr;
  *pcVar15 = L'<';
  pcVar15 = pcVar15 + 1;
  if (cchTag != 0) {
    lVar13 = 0;
    do {
      cVar4 = *(char16_t *)((long)pszTag + lVar13);
      if (bVar3 == false) {
        cVar4 = PAL_towupper(cVar4);
      }
      *(char16_t *)((long)pcVar15 + lVar13) = cVar4;
      lVar13 = lVar13 + 2;
    } while ((ulong)cchTag * 2 != lVar13);
    pcVar15 = (char16_t *)((long)pcVar15 + lVar13);
  }
  if (pszProp != (char16 *)0x0) {
    *pcVar15 = L' ';
    pcVar18 = pcVar15 + 1;
    if (builder.m_string._4_4_ != 0) {
      uVar19 = (ulong)builder.m_string._4_4_;
      uVar10 = 0;
      do {
        pcVar15 = pcVar18;
        cVar4 = pszProp[uVar10];
        if (bVar3 == false) {
          cVar4 = PAL_towupper(cVar4);
        }
        *pcVar15 = cVar4;
        uVar10 = uVar10 + 1;
        pcVar18 = pcVar15 + 1;
      } while (uVar19 != uVar10);
    }
    *pcVar18 = L'=';
    pcVar15[2] = L'\"';
    if (local_60 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xd28,"(propertyValueStr != nullptr)",
                                  "propertyValueStr != nullptr");
      if (!bVar2) goto LAB_00d2bc8c;
      *puVar11 = 0;
    }
    pcVar12 = pcVar15 + 3;
    if ((bVar3 == false) || (uVar17 == 0)) {
      BufferStringBuilder::DbgAssertNotFrozen(&local_50);
      js_wmemcpy_s(pcVar12,~((long)pcVar12 -
                             (long)((local_50.m_string)->super_JavascriptString).m_pszValue.ptr >> 1
                            ) + (ulong)length,local_60,count);
      pcVar12 = pcVar12 + count;
    }
    else if (uVar6 != 0) {
      uVar10 = 0;
      do {
        if (local_60[uVar10] == L'\"') {
          BufferStringBuilder::DbgAssertNotFrozen(&local_50);
          uVar16 = ~(uint)((ulong)((long)pcVar12 -
                                  (long)((local_50.m_string)->super_JavascriptString).m_pszValue.ptr
                                  ) >> 1) + length;
          js_wmemcpy_s(pcVar12,(ulong)uVar16,local_a0,6);
          pcVar12 = pcVar12 + 6;
          uVar17 = uVar17 - 1;
          if (uVar17 == 0) {
            uVar14 = (int)uVar10 + 1;
            uVar10 = (ulong)(uVar6 - uVar14);
            js_wmemcpy_s(pcVar12,(ulong)(uVar16 - 6),local_60 + uVar14,uVar10);
            pcVar12 = pcVar12 + uVar10;
            break;
          }
        }
        else {
          *pcVar12 = local_60[uVar10];
          pcVar12 = pcVar12 + 1;
        }
        uVar16 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar16;
      } while (uVar16 < uVar6);
    }
    *pcVar12 = L'\"';
    pcVar15 = pcVar12 + 1;
  }
  *pcVar15 = L'>';
  pcVar12 = GetString(stack0xffffffffffffff70);
  BufferStringBuilder::DbgAssertNotFrozen(&local_50);
  js_wmemcpy_s(pcVar15 + 1,
               ~((long)(pcVar15 + 1) -
                 (long)((local_50.m_string)->super_JavascriptString).m_pszValue.ptr >> 1) +
               (ulong)length,pcVar12,count_00);
  pcVar18 = pcVar15 + count_00 + 3;
  (pcVar15 + count_00 + 1)[0] = L'<';
  (pcVar15 + count_00 + 1)[1] = L'/';
  if (cchTag != 0) {
    lVar13 = 0;
    do {
      cVar4 = *(char16_t *)((long)pszTag + lVar13);
      if (bVar3 == false) {
        cVar4 = PAL_towupper(cVar4);
      }
      *(char16_t *)((long)pcVar18 + lVar13) = cVar4;
      lVar13 = lVar13 + 2;
    } while ((ulong)cchTag * 2 != lVar13);
    pcVar18 = (char16_t *)((long)pcVar18 + lVar13);
  }
  *pcVar18 = L'>';
  BufferStringBuilder::DbgAssertNotFrozen(&local_50);
  if (length != (uint)((ulong)((long)pcVar18 +
                              (2 - (long)((local_50.m_string)->super_JavascriptString).m_pszValue.
                                         ptr)) >> 1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xd71,
                                "((charcount_t)(pResult - builder.DangerousGetWritableBuffer()) == cchTotalChars)"
                                ,"Exceeded allocated string limit");
    if (!bVar3) {
LAB_00d2bc8c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar11 = 0;
  }
  pJVar9 = BufferStringBuilder::ToString(&local_50);
  return pJVar9;
}

Assistant:

Var JavascriptString::StringBracketHelper(Arguments args, ScriptContext *scriptContext, __in_ecount(cchTag) char16 const *pszTag,
                                                charcount_t cchTag, __in_ecount_opt(cchProp) char16 const *pszProp, charcount_t cchProp)
    {
        charcount_t cchThis;
        charcount_t cchPropertyValue;
        charcount_t cchTotalChars;
        charcount_t ich;
        JavascriptString * pThis = nullptr;
        JavascriptString * pPropertyValue = nullptr;
        const char16 * propertyValueStr = nullptr;
        uint quotesCount = 0;
        const char16 quotStr[] = _u("&quot;");
        const charcount_t quotStrLen = _countof(quotStr) - 1;
        bool ES6FixesEnabled = scriptContext->GetConfig()->IsES6StringPrototypeFixEnabled();

        // Assemble the component pieces of a string tag function (ex: String.prototype.link).
        // In the general case, result is as below:
        //
        // pszProp = _u("href");
        // pszTag = _u("a");
        // pThis = VarTo<JavascriptString>(args[0]);
        // pPropertyValue = VarTo<JavascriptString>(args[1]);
        //
        // pResult = _u("<a href=\"[[pPropertyValue]]\">[[pThis]]</a>");
        //
        // cchTotalChars = 5                    // <></>
        //                 + cchTag * 2         // a
        //                 + cchProp            // href
        //                 + 4                  // _=""
        //                 + cchPropertyValue
        //                 + cchThis;
        //
        // Note: With ES6FixesEnabled, we need to escape quote characters (_u('"')) in pPropertyValue.
        // Note: Without ES6FixesEnabled, the tag and prop strings should be capitalized.

        if(args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedString);
        }

        if (ES6FixesEnabled)
        {
            if (!JavascriptConversion::CheckObjectCoercible(args[0], scriptContext))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, pszTag);
            }
        }

        pThis = JavascriptOperators::TryFromVar<JavascriptString>(args[0]);
        if (!pThis)
        {
            pThis = JavascriptConversion::ToString(args[0], scriptContext);
        }

        cchThis = pThis->GetLength();
        cchTotalChars = UInt32Math::Add(cchTag, cchTag);

        // 5 is for the <></> characters
        cchTotalChars = UInt32Math::Add(cchTotalChars, 5);

        if (nullptr != pszProp)
        {
            // Need one string argument.
            if (args.Info.Count >= 2)
            {
                pPropertyValue = JavascriptOperators::TryFromVar<JavascriptString>(args[1]);
                if (!pPropertyValue)
                {
                    pPropertyValue = JavascriptConversion::ToString(args[1], scriptContext);
                }
            }
            else
            {
                pPropertyValue = scriptContext->GetLibrary()->GetUndefinedDisplayString();
            }

            cchPropertyValue = pPropertyValue->GetLength();
            propertyValueStr = pPropertyValue->GetString();

            if (ES6FixesEnabled)
            {
                // Count the number of " characters we need to escape.
                for (ich = 0; ich < cchPropertyValue; ich++)
                {
                    if (propertyValueStr[ich] == _u('"'))
                    {
                        ++quotesCount;
                    }
                }
            }

            cchTotalChars = UInt32Math::Add(cchTotalChars, cchProp);

            // 4 is for the _="" characters
            cchTotalChars = UInt32Math::Add(cchTotalChars, 4);

            if (ES6FixesEnabled)
            {
                // Account for the " escaping (&quot;)
                cchTotalChars = UInt32Math::Add(cchTotalChars, UInt32Math::Mul(quotesCount, quotStrLen)) - quotesCount;
            }
        }
        else
        {
            cchPropertyValue = 0;
            cchProp = 0;
        }
        cchTotalChars = UInt32Math::Add(cchTotalChars, cchThis);
        cchTotalChars = UInt32Math::Add(cchTotalChars, cchPropertyValue);
        if (!IsValidCharCount(cchTotalChars) || cchTotalChars < cchThis || cchTotalChars < cchPropertyValue)
        {
            Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
        }

        BufferStringBuilder builder(cchTotalChars, scriptContext);
        char16 *pResult = builder.DangerousGetWritableBuffer();

        *pResult++ = _u('<');
        for (ich = 0; ich < cchTag; ich++)
        {
            *pResult++ = ES6FixesEnabled ? pszTag[ich] : towupper(pszTag[ich]);
        }
        if (nullptr != pszProp)
        {
            *pResult++ = _u(' ');
            for (ich = 0; ich < cchProp; ich++)
            {
                *pResult++ = ES6FixesEnabled ? pszProp[ich] : towupper(pszProp[ich]);
            }
            *pResult++ = _u('=');
            *pResult++ = _u('"');

            Assert(propertyValueStr != nullptr);

            if (!ES6FixesEnabled || quotesCount == 0)
            {
                js_wmemcpy_s(pResult,
                    cchTotalChars - (pResult - builder.DangerousGetWritableBuffer() + 1),
                    propertyValueStr,
                    cchPropertyValue);

                pResult += cchPropertyValue;
            }
            else {
                for (ich = 0; ich < cchPropertyValue; ich++)
                {
                    if (propertyValueStr[ich] == _u('"'))
                    {
                        charcount_t destLengthLeft = (cchTotalChars - (charcount_t)(pResult - builder.DangerousGetWritableBuffer() + 1));

                        // Copy the quote string into result beginning at the index where the quote would appear
                        js_wmemcpy_s(pResult,
                            destLengthLeft,
                            quotStr,
                            quotStrLen);

                        // Move result ahead by the length of the quote string
                        pResult += quotStrLen;
                        // We ate one of the quotes
                        quotesCount--;

                        // We only need to check to see if we have no more quotes after eating a quote
                        if (quotesCount == 0)
                        {
                            // Skip the quote character.
                            // Note: If ich is currently the last character (cchPropertyValue-1), it becomes cchPropertyValue after incrementing.
                            // At that point, cchPropertyValue - ich == 0 so we will not increment pResult and will call memcpy for zero bytes.
                            ich++;

                            // Copy the rest from the property value string starting at the index after the last quote
                            js_wmemcpy_s(pResult,
                                destLengthLeft - quotStrLen,
                                propertyValueStr + ich,
                                cchPropertyValue - ich);

                            // Move result ahead by the length of the rest of the property string
                            pResult += (cchPropertyValue - ich);
                            break;
                        }
                    }
                    else
                    {
                        // Each non-quote character just gets copied into result string
                        *pResult++ = propertyValueStr[ich];
                    }
                }
            }

            *pResult++ = _u('"');
        }
        *pResult++ = _u('>');

        const char16 *pThisString = pThis->GetString();
        js_wmemcpy_s(pResult, cchTotalChars - (pResult - builder.DangerousGetWritableBuffer() + 1), pThisString, cchThis);
        pResult += cchThis;

        *pResult++ = _u('<');
        *pResult++ = _u('/');
        for (ich = 0; ich < cchTag; ich++)
        {
            *pResult++ = ES6FixesEnabled ? pszTag[ich] : towupper(pszTag[ich]);
        }
        *pResult++ = _u('>');

        // Assert we ended at the right place.
        AssertMsg((charcount_t)(pResult - builder.DangerousGetWritableBuffer()) == cchTotalChars, "Exceeded allocated string limit");

        return builder.ToString();
    }